

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

void __thiscall ZippedFile::ZippedFile(ZippedFile *this,ITypeManager *type_manager,string *file)

{
  string *file_local;
  ITypeManager *type_manager_local;
  ZippedFile *this_local;
  
  IContainedElement::IContainedElement(&this->super_IContainedElement,type_manager);
  (this->super_IContainedElement)._vptr_IContainedElement = (_func_int **)&PTR__ZippedFile_0022cf28;
  std::__cxx11::string::string((string *)&this->file_name_,(string *)file);
  NodeFS::NodeFS(&this->zip_file_);
  InitUnzip(this);
  return;
}

Assistant:

ZippedFile::ZippedFile(ITypeManager* type_manager, const std::string& file) : IContainedElement(type_manager),
                                                                              file_name_(file)
{
   // Unzip to file
   InitUnzip();
}